

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O3

OPAtomIndexFooter * __thiscall
ASDCP::MXF::OPAtomIndexFooter::WriteToFile
          (OPAtomIndexFooter *this,FileWriter *Writer,ui64_t duration)

{
  long *plVar1;
  int iVar2;
  long lVar3;
  MDDEntry *pMVar4;
  undefined8 in_RCX;
  long *plVar5;
  FrameBuffer FooterBuffer;
  FrameBuffer WriteWrapper;
  Result_t result;
  FrameBuffer local_1c0;
  undefined8 local_198;
  FrameBuffer local_190;
  undefined1 local_168 [104];
  FrameBuffer local_100 [2];
  FrameBuffer local_98 [2];
  
  if (*(long *)(Writer + 0x78) == 0) {
    __assert_fail("m_Dict",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/MXF.cpp"
                  ,0x49e,
                  "virtual ASDCP::Result_t ASDCP::MXF::OPAtomIndexFooter::WriteToFile(Kumu::FileWriter &, ui64_t)"
                 );
  }
  local_198 = in_RCX;
  FrameBuffer::FrameBuffer(&local_1c0);
  FrameBuffer::Capacity((FrameBuffer *)(local_168 + 0x68),(ui32_t)&local_1c0);
  lVar3 = *(long *)(Writer + 0x140);
  if (lVar3 != 0) {
    *(long *)(lVar3 + 200) =
         (*(long *)(lVar3 + 0x110) - *(long *)(lVar3 + 0x108) >> 3) * -0x5555555555555555;
    *(undefined8 *)(Writer + 0x140) = 0;
  }
  plVar5 = (long *)**(long **)(Writer + 0x70);
  if (plVar5 != *(long **)(Writer + 0x70)) {
    iVar2 = 0;
    do {
      if ((int)(ui32_t)local_100[0]._vptr_FrameBuffer < 0) goto LAB_001a7ee1;
      plVar1 = (long *)plVar5[2];
      if ((plVar1 != (long *)0x0) &&
         (lVar3 = __dynamic_cast(plVar1,&InterchangeObject::typeinfo,&IndexTableSegment::typeinfo,0)
         , lVar3 != 0)) {
        if (*(int *)(Writer + 0x148) == 0) {
          iVar2 = iVar2 + 1;
        }
        else {
          if (iVar2 != 0) {
            Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_STATE);
            goto LAB_001a7ef6;
          }
          *(undefined8 *)(lVar3 + 200) = local_198;
          iVar2 = 1;
        }
      }
      plVar1[10] = *(long *)(Writer + 0x180);
      FrameBuffer::FrameBuffer(&local_190);
      FrameBuffer::SetData
                ((FrameBuffer *)(local_168 + 0xd0),(byte_t *)&local_190,
                 local_1c0.m_Size + (int)local_1c0.m_Data);
      Kumu::Result_t::~Result_t((Result_t *)(local_168 + 0xd0));
      (**(code **)(*plVar1 + 0x70))((Result_t *)local_168,plVar1,&local_190);
      Kumu::Result_t::operator=((Result_t *)(local_168 + 0x68),(Result_t *)local_168);
      Kumu::Result_t::~Result_t((Result_t *)local_168);
      local_1c0.m_Size = local_1c0.m_Size + local_190.m_Size;
      FrameBuffer::~FrameBuffer(&local_190);
      plVar5 = (long *)*plVar5;
    } while (plVar5 != (long *)*(long *)(Writer + 0x70));
  }
  if (-1 < (int)(ui32_t)local_100[0]._vptr_FrameBuffer) {
    *(ulong *)(Writer + 0xa8) = (ulong)local_1c0.m_Size;
    pMVar4 = Dictionary::Type(*(Dictionary **)(Writer + 0x78),MDD_CompleteFooter);
    local_190.m_Data._0_1_ = 1;
    local_190._9_8_ = *(undefined8 *)pMVar4->ul;
    local_190._17_7_ = SUB87(*(undefined8 *)(pMVar4->ul + 8),0);
    local_190.m_Size._0_1_ = (undefined1)((ulong)*(undefined8 *)(pMVar4->ul + 8) >> 0x38);
    local_190._vptr_FrameBuffer = (_func_int **)&PTR__IArchive_0021d318;
    Partition::WriteToFile((Partition *)local_168,Writer,(UL *)duration);
    Kumu::Result_t::operator=((Result_t *)(local_168 + 0x68),(Result_t *)local_168);
    Kumu::Result_t::~Result_t((Result_t *)local_168);
    if (-1 < (int)(ui32_t)local_100[0]._vptr_FrameBuffer) {
      local_190._vptr_FrameBuffer =
           (_func_int **)((ulong)local_190._vptr_FrameBuffer & 0xffffffff00000000);
      Kumu::FileWriter::Write(local_168,(uint)duration,(uint *)local_1c0.m_Data);
      Kumu::Result_t::operator=((Result_t *)(local_168 + 0x68),(Result_t *)local_168);
      Kumu::Result_t::~Result_t((Result_t *)local_168);
      if ((uint)local_190._vptr_FrameBuffer != local_1c0.m_Size) {
        __assert_fail("write_count == FooterBuffer.Size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/MXF.cpp"
                      ,0x4d0,
                      "virtual ASDCP::Result_t ASDCP::MXF::OPAtomIndexFooter::WriteToFile(Kumu::FileWriter &, ui64_t)"
                     );
      }
    }
  }
LAB_001a7ee1:
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)(local_168 + 0x68));
LAB_001a7ef6:
  Kumu::Result_t::~Result_t((Result_t *)(local_168 + 0x68));
  FrameBuffer::~FrameBuffer(&local_1c0);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::OPAtomIndexFooter::WriteToFile(Kumu::FileWriter& Writer, ui64_t duration)
{
  assert(m_Dict);
  ASDCP::FrameBuffer FooterBuffer;
  ui32_t   footer_size = m_PacketList->m_List.size() * MaxIndexSegmentSize; // segment-count * max-segment-size
  Result_t result = FooterBuffer.Capacity(footer_size); 
  ui32_t   iseg_count = 0;

  if ( m_CurrentSegment != 0 )
    {
      m_CurrentSegment->IndexDuration = m_CurrentSegment->IndexEntryArray.size();
      m_CurrentSegment = 0;
    }

  std::list<InterchangeObject*>::iterator pl_i = m_PacketList->m_List.begin();
  for ( ; pl_i != m_PacketList->m_List.end() && ASDCP_SUCCESS(result); pl_i++ )
    {
      IndexTableSegment *segment = dynamic_cast<IndexTableSegment*>(*pl_i);

      if ( segment != 0 )
	{
	  iseg_count++;
	  if ( m_BytesPerEditUnit != 0 )
	    {
	      if ( iseg_count != 1 )
		return RESULT_STATE;

	      segment->IndexDuration = duration;
	    }
	}

      InterchangeObject* object = *pl_i;
      object->m_Lookup = m_Lookup;

      ASDCP::FrameBuffer WriteWrapper;
      WriteWrapper.SetData(FooterBuffer.Data() + FooterBuffer.Size(),
			   FooterBuffer.Capacity() - FooterBuffer.Size());
      result = object->WriteToBuffer(WriteWrapper);
      FooterBuffer.Size(FooterBuffer.Size() + WriteWrapper.Size());
    }

  if ( ASDCP_SUCCESS(result) )
    {
      IndexByteCount = FooterBuffer.Size();
      UL FooterUL(m_Dict->ul(MDD_CompleteFooter));
      result = Partition::WriteToFile(Writer, FooterUL);
    }

  if ( ASDCP_SUCCESS(result) )
    {
      ui32_t write_count = 0;
      result = Writer.Write(FooterBuffer.RoData(), FooterBuffer.Size(), &write_count);
      assert(write_count == FooterBuffer.Size());
    }

  return result;
}